

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void calc_mean_and_sd_weighted<float,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,float *x,
               vector<double,_std::allocator<double>_> *w,MissingAction missing_action,double *x_sd,
               double *x_mean)

{
  double __x;
  pointer pdVar1;
  double dVar2;
  double dVar3;
  size_t row;
  double __z;
  double __z_00;
  double dVar4;
  
  do {
    dVar2 = (double)x[ix_arr[st]];
    if (NAN(x[ix_arr[st]])) {
      if (end < st) {
LAB_0024419c:
        pdVar1 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar4 = 0.0;
        __z_00 = 0.0;
        __z = 0.0;
        for (; st <= end; st = st + 1) {
          dVar3 = (double)x[ix_arr[st]];
          if ((!NAN(x[ix_arr[st]])) && (ABS(dVar3) != INFINITY)) {
            __x = pdVar1[ix_arr[st]];
            dVar4 = dVar4 + __x;
            __z_00 = fma(__x,(dVar3 - __z_00) / dVar4,__z_00);
            __z = fma(__x,(dVar3 - dVar2) * (dVar3 - __z_00),__z);
            dVar2 = __z_00;
          }
        }
        *x_mean = __z_00;
        *x_sd = SQRT(__z / dVar4);
        return;
      }
    }
    else if ((end < st) || (ABS(dVar2) != INFINITY)) goto LAB_0024419c;
    st = st + 1;
  } while( true );
}

Assistant:

void calc_mean_and_sd_weighted(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x, mapping &restrict w,
                               MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    ldouble_safe cnt = 0;
    ldouble_safe w_this;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = x[ix_arr[st]];
    ldouble_safe xval;
    while (is_na_or_inf(m_prev) && st <= end)
    {
        m_prev = x[ix_arr[++st]];
    }

    for (size_t row = st; row <= end; row++)
    {
        xval = x[ix_arr[row]];
        if (likely(!is_na_or_inf(xval)))
        {
            w_this = w[ix_arr[row]];
            cnt += w_this;
            m = std::fma(w_this, (xval - m) / cnt, m);
            s = std::fma(w_this, (xval - m) * (xval - m_prev), s);
            m_prev = m;
        }
    }

    x_mean = m;
    x_sd   = std::sqrt((ldouble_safe)s / (ldouble_safe)cnt);
}